

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_CECoordinates.cpp
# Opt level: O0

bool __thiscall test_CECoordinates::test_HmsDms2Angle(test_CECoordinates *this)

{
  double dVar1;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  byte bVar2;
  vector *in_RDI;
  double test4b;
  double test4a;
  vector<double,_std::allocator<double>_> test3;
  double test2b;
  double test2a;
  vector<double,_std::allocator<double>_> test1;
  double tol_old;
  vector<double,_std::allocator<double>_> hrs_vec;
  vector<double,_std::allocator<double>_> ang_vec;
  double ang_rad;
  double ang_var;
  allocator *paVar3;
  allocator_type *in_stack_fffffffffffffd48;
  allocator *paVar4;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffd50;
  CEAngleType *angle_type;
  double *in_stack_fffffffffffffd58;
  size_type in_stack_fffffffffffffd60;
  CEAngleType *return_type;
  vector<double,_std::allocator<double>_> *angle;
  undefined4 local_260;
  allocator local_259;
  string local_258 [36];
  undefined4 local_234;
  double local_230;
  undefined4 local_228;
  allocator local_221;
  string local_220 [36];
  undefined4 local_1fc;
  double local_1f8;
  undefined4 local_1f0;
  allocator local_1e9;
  string local_1e8 [36];
  undefined4 local_1c4;
  vector local_1c0 [24];
  undefined4 local_1a8;
  allocator local_1a1;
  string local_1a0 [36];
  undefined4 local_17c;
  CEAngleType *local_178;
  undefined4 local_170;
  allocator local_169;
  string local_168 [36];
  undefined4 local_144;
  double local_140;
  undefined4 local_138;
  allocator local_131;
  string local_130 [36];
  undefined4 local_10c;
  vector local_108 [24];
  undefined8 local_f0;
  CEAngleType *local_e8;
  undefined1 local_d9 [25];
  undefined8 uStack_c0;
  undefined1 *local_b8;
  undefined8 local_b0;
  string local_a8 [32];
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 *local_60;
  undefined8 local_58;
  string local_50 [40];
  CEAngle local_28;
  double local_18 [3];
  
  local_18[1] = 45.50833333333333;
  CEAngle::Deg(in_stack_fffffffffffffd58);
  dVar1 = CEAngle::Rad(&local_28);
  CEAngle::~CEAngle((CEAngle *)0x124d9a);
  local_78 = 0x403e000000000000;
  uStack_70 = 0;
  local_88 = 0x4046800000000000;
  uStack_80 = 0x403e000000000000;
  local_60 = &local_88;
  local_58 = 4;
  local_18[0] = dVar1;
  std::allocator<double>::allocator((allocator<double> *)0x124df8);
  __l._M_len = in_stack_fffffffffffffd60;
  __l._M_array = in_stack_fffffffffffffd58;
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffd50,__l,in_stack_fffffffffffffd48);
  std::allocator<double>::~allocator((allocator<double> *)0x124e29);
  local_d9._17_8_ = 0x4000000000000000;
  uStack_c0 = 0;
  local_d9._1_8_ = 0x4008000000000000;
  local_d9._9_8_ = 0x4000000000000000;
  local_b8 = local_d9 + 1;
  local_b0 = 4;
  angle = (vector<double,_std::allocator<double>_> *)local_d9;
  std::allocator<double>::allocator((allocator<double> *)0x124e75);
  __l_00._M_len = in_stack_fffffffffffffd60;
  __l_00._M_array = in_stack_fffffffffffffd58;
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffd50,__l_00,in_stack_fffffffffffffd48);
  std::allocator<double>::~allocator((allocator<double> *)0x124ea6);
  return_type = (CEAngleType *)(**(code **)(*(long *)in_RDI + 0x20))();
  local_f0 = 0x3da5fd7fe1796495;
  local_e8 = return_type;
  (**(code **)(*(long *)in_RDI + 0x30))(in_RDI,&local_f0);
  local_10c = 0;
  CECoordinates::GetDMS(in_stack_fffffffffffffd58,(CEAngleType *)in_stack_fffffffffffffd50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,"test_HmsDms2Angle",&local_131);
  local_138 = 0x204;
  CETestSuite::test_vect(in_RDI,local_108,local_50,(int *)local_130);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  local_144 = 0;
  local_140 = CECoordinates::DMSToAngle(angle,return_type);
  paVar3 = &local_169;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_168,"test_HmsDms2Angle",paVar3);
  local_170 = 0x208;
  (**(code **)(*(long *)in_RDI + 0x58))(in_RDI,&local_140,local_18 + 1,local_168,&local_170);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator((allocator<char> *)&local_169);
  local_17c = 1;
  angle_type = (CEAngleType *)CECoordinates::DMSToAngle(angle,return_type);
  paVar4 = &local_1a1;
  local_178 = angle_type;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a0,"test_HmsDms2Angle",paVar4);
  local_1a8 = 0x20a;
  (**(code **)(*(long *)in_RDI + 0x58))(in_RDI,&local_178,local_18,local_1a0,&local_1a8);
  std::__cxx11::string::~string(local_1a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
  local_1c4 = 0;
  CECoordinates::GetHMS((double *)paVar3,angle_type);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e8,"test_HmsDms2Angle",&local_1e9);
  local_1f0 = 0x20e;
  CETestSuite::test_vect(in_RDI,local_1c0,local_a8,(int *)local_1e8);
  std::__cxx11::string::~string(local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  local_1fc = 0;
  local_1f8 = CECoordinates::HMSToAngle(angle,return_type);
  paVar3 = &local_221;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_220,"test_HmsDms2Angle",paVar3);
  local_228 = 0x212;
  (**(code **)(*(long *)in_RDI + 0x58))(in_RDI,&local_1f8,local_18 + 1,local_220,&local_228);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  local_234 = 1;
  local_230 = CECoordinates::HMSToAngle(angle,return_type);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_258,"test_HmsDms2Angle",&local_259);
  local_260 = 0x214;
  (**(code **)(*(long *)in_RDI + 0x58))(in_RDI,&local_230,local_18,local_258,&local_260);
  std::__cxx11::string::~string(local_258);
  std::allocator<char>::~allocator((allocator<char> *)&local_259);
  (**(code **)(*(long *)in_RDI + 0x30))(in_RDI,&local_e8);
  bVar2 = (**(code **)(*(long *)in_RDI + 0x18))();
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)paVar3);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)paVar3);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)paVar3);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)paVar3);
  return (bool)(bVar2 & 1);
}

Assistant:

bool test_CECoordinates::test_HmsDms2Angle(void)
{
    // Create some variables for testing
    double              ang_var(45.50833333333333);
    double              ang_rad = CEAngle::Deg(ang_var).Rad();
    std::vector<double> ang_vec = {45, 30, 30, 0.0};
    std::vector<double> hrs_vec = {3.0, 2.0, 2.0, 0.0};

    // Increase the acceptable tolerance
    double tol_old(DblTol());
    SetDblTol(1.0e-11);

    // Test angle -> DMS 
    std::vector<double> test1 = CECoordinates::GetDMS(ang_var, CEAngleType::DEGREES);
    test_vect(test1, ang_vec, __func__, __LINE__);

    // Test DMS -> angle
    double test2a(CECoordinates::DMSToAngle(ang_vec, CEAngleType::DEGREES));
    test_double(test2a, ang_var, __func__, __LINE__);
    double test2b(CECoordinates::DMSToAngle(ang_vec, CEAngleType::RADIANS));
    test_double(test2b, ang_rad, __func__, __LINE__);
    
    // Test angle -> HMS 
    std::vector<double> test3 = CECoordinates::GetHMS(ang_var, CEAngleType::DEGREES);
    test_vect(test3, hrs_vec, __func__, __LINE__);

    // Test HMS -> angle
    double test4a(CECoordinates::HMSToAngle(hrs_vec, CEAngleType::DEGREES));
    test_double(test4a, ang_var, __func__, __LINE__);
    double test4b(CECoordinates::HMSToAngle(hrs_vec, CEAngleType::RADIANS));
    test_double(test4b, ang_rad, __func__, __LINE__);

    // Reset the tolerance
    SetDblTol(tol_old);

    return pass();
}